

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

char * luaL_buffinitsize(lua_State *L,luaL_Buffer *B,size_t sz)

{
  char *pcVar1;
  size_t sz_local;
  luaL_Buffer *B_local;
  lua_State *L_local;
  
  luaL_buffinit(L,B);
  pcVar1 = prepbuffsize(B,sz,-1);
  return pcVar1;
}

Assistant:

LUALIB_API char *luaL_buffinitsize (lua_State *L, luaL_Buffer *B, size_t sz) {
  luaL_buffinit(L, B);
  return prepbuffsize(B, sz, -1);
}